

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void cgltf_node_transform_local(cgltf_node *node,cgltf_float *out_matrix)

{
  cgltf_float cVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  if (node->has_matrix != 0) {
    uVar8 = *(undefined8 *)node->matrix;
    uVar9 = *(undefined8 *)(node->matrix + 2);
    uVar10 = *(undefined8 *)(node->matrix + 4);
    uVar11 = *(undefined8 *)(node->matrix + 6);
    uVar12 = *(undefined8 *)(node->matrix + 8);
    uVar13 = *(undefined8 *)(node->matrix + 10);
    uVar14 = *(undefined8 *)(node->matrix + 0xe);
    *(undefined8 *)(out_matrix + 0xc) = *(undefined8 *)(node->matrix + 0xc);
    *(undefined8 *)(out_matrix + 0xe) = uVar14;
    *(undefined8 *)(out_matrix + 8) = uVar12;
    *(undefined8 *)(out_matrix + 10) = uVar13;
    *(undefined8 *)(out_matrix + 4) = uVar10;
    *(undefined8 *)(out_matrix + 6) = uVar11;
    *(undefined8 *)out_matrix = uVar8;
    *(undefined8 *)(out_matrix + 2) = uVar9;
    return;
  }
  uVar8 = *(undefined8 *)node->translation;
  cVar1 = node->translation[2];
  fVar16 = node->rotation[0];
  fVar2 = node->rotation[1];
  fVar3 = node->rotation[2];
  fVar4 = node->rotation[3];
  fVar5 = node->scale[0];
  fVar6 = node->scale[1];
  fVar7 = node->scale[2];
  fVar15 = fVar2 + fVar2;
  fVar18 = -(fVar3 + fVar3) * fVar3;
  *out_matrix = (-fVar15 * fVar2 + 1.0 + fVar18) * fVar5;
  fVar17 = fVar16 + fVar16;
  fVar19 = (fVar3 + fVar3) * fVar4;
  out_matrix[1] = (fVar2 * fVar17 + fVar19) * fVar5;
  out_matrix[2] = (fVar17 * fVar3 - fVar15 * fVar4) * fVar5;
  out_matrix[3] = 0.0;
  out_matrix[4] = (fVar2 * fVar17 - fVar19) * fVar6;
  fVar16 = 1.0 - fVar16 * fVar17;
  out_matrix[5] = (fVar18 + fVar16) * fVar6;
  out_matrix[6] = (fVar15 * fVar3 + fVar17 * fVar4) * fVar6;
  out_matrix[7] = 0.0;
  out_matrix[8] = (fVar17 * fVar3 + fVar15 * fVar4) * fVar7;
  out_matrix[9] = (fVar15 * fVar3 - fVar17 * fVar4) * fVar7;
  out_matrix[10] = (fVar16 + -fVar15 * fVar2) * fVar7;
  out_matrix[0xb] = 0.0;
  *(undefined8 *)(out_matrix + 0xc) = uVar8;
  out_matrix[0xe] = cVar1;
  out_matrix[0xf] = 1.0;
  return;
}

Assistant:

void cgltf_node_transform_local(const cgltf_node* node, cgltf_float* out_matrix)
{
    cgltf_float* lm = out_matrix;

    if (node->has_matrix)
    {
        memcpy(lm, node->matrix, sizeof(float) * 16);
    }
    else
    {
        float tx = node->translation[0];
        float ty = node->translation[1];
        float tz = node->translation[2];

        float qx = node->rotation[0];
        float qy = node->rotation[1];
        float qz = node->rotation[2];
        float qw = node->rotation[3];

        float sx = node->scale[0];
        float sy = node->scale[1];
        float sz = node->scale[2];

        lm[0] = (1 - 2 * qy*qy - 2 * qz*qz) * sx;
        lm[1] = (2 * qx*qy + 2 * qz*qw) * sx;
        lm[2] = (2 * qx*qz - 2 * qy*qw) * sx;
        lm[3] = 0.f;

        lm[4] = (2 * qx*qy - 2 * qz*qw) * sy;
        lm[5] = (1 - 2 * qx*qx - 2 * qz*qz) * sy;
        lm[6] = (2 * qy*qz + 2 * qx*qw) * sy;
        lm[7] = 0.f;

        lm[8] = (2 * qx*qz + 2 * qy*qw) * sz;
        lm[9] = (2 * qy*qz - 2 * qx*qw) * sz;
        lm[10] = (1 - 2 * qx*qx - 2 * qy*qy) * sz;
        lm[11] = 0.f;

        lm[12] = tx;
        lm[13] = ty;
        lm[14] = tz;
        lm[15] = 1.f;
    }
}